

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score.cc
# Opt level: O2

void __thiscall
xLearn::LinearScore::calc_grad_adagrad
          (LinearScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  uint uVar1;
  real_t *prVar2;
  pointer pNVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer pNVar6;
  ulong uVar7;
  float fVar8;
  undefined1 in_register_00001204 [60];
  undefined1 auVar9 [64];
  float fVar10;
  
  auVar9._4_60_ = in_register_00001204;
  auVar9._0_4_ = pg;
  prVar2 = model->param_w_;
  uVar1 = model->num_feat_;
  pNVar3 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pNVar6 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                super__Vector_impl_data._M_start; pNVar6 != pNVar3; pNVar6 = pNVar6 + 1) {
    if (pNVar6->feat_id < uVar1) {
      uVar7 = (ulong)(pNVar6->feat_id * 2);
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(pg * pNVar6->feat_val)),ZEXT416((uint)prVar2[uVar7]),
                               ZEXT416((uint)(this->super_Score).regu_lambda_));
      auVar5 = vfmadd231ss_fma(ZEXT416((uint)prVar2[uVar7 + 1]),auVar4,auVar4);
      fVar10 = auVar5._0_4_;
      prVar2[uVar7 + 1] = fVar10;
      fVar8 = (float)(0x5f375a86 - ((int)fVar10 >> 1));
      auVar5 = vfmadd213ss_fma(ZEXT416((uint)(fVar10 * -0.5 * fVar8)),ZEXT416((uint)fVar8),
                               SUB6416(ZEXT464(0x3fc00000),0));
      auVar5 = vfnmadd213ss_fma(ZEXT416((uint)(auVar4._0_4_ * (this->super_Score).learning_rate_)),
                                ZEXT416((uint)(auVar5._0_4_ * fVar8)),ZEXT416((uint)prVar2[uVar7]));
      prVar2[uVar7] = auVar5._0_4_;
    }
  }
  prVar2 = model->param_b_;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)prVar2[1]),auVar9._0_16_,auVar9._0_16_);
  fVar10 = auVar5._0_4_;
  prVar2[1] = fVar10;
  fVar8 = (float)(0x5f375a86 - ((int)fVar10 >> 1));
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)(fVar10 * -0.5 * fVar8)),ZEXT416((uint)fVar8),
                           ZEXT416(0x3fc00000));
  auVar5 = vfnmadd213ss_fma(ZEXT416((uint)(pg * (this->super_Score).learning_rate_)),
                            ZEXT416((uint)(auVar5._0_4_ * fVar8)),ZEXT416((uint)*prVar2));
  *prVar2 = auVar5._0_4_;
  return;
}

Assistant:

void LinearScore::calc_grad_adagrad(const SparseRow* row,
                                    Model& model,
                                    real_t pg,
                                    real_t norm) {
  // linear term
  real_t* w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t gradient = pg * iter->feat_val;
    index_t idx_g = feat_id * 2;
    index_t idx_c = idx_g + 1;
    gradient += regu_lambda_ * w[idx_g];
    w[idx_c] += (gradient * gradient);
    w[idx_g] -= (learning_rate_ * gradient *
                 InvSqrt(w[idx_c]));
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t g = pg;
  wbg += g*g;
  wb -= learning_rate_ * g * InvSqrt(wbg);
}